

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-shutdown-eof.c
# Opt level: O0

void timer_cb(uv_timer_t *timer)

{
  int iVar1;
  void **ppvVar2;
  uint64_t uVar3;
  poll_ctx *ctx;
  uv_timer_t *timer_local;
  
  ppvVar2 = timer[-1].node.heap + 1;
  if (*ppvVar2 == (void *)0x0) {
    __assert_fail("ctx->parent_handle != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/fs-poll.c"
                  ,0xb0,"void timer_cb(uv_timer_t *)");
  }
  if (*(void ***)((long)*ppvVar2 + 0x40) == ppvVar2) {
    uVar3 = uv_now((uv_loop_t *)timer[-1].repeat);
    timer[-1].timeout = uVar3;
    iVar1 = uv_fs_stat((uv_loop_t *)timer[-1].repeat,(uv_fs_t *)(timer + 1),(char *)&timer[6].type,
                       poll_cb);
    if (iVar1 != 0) {
      abort();
    }
    return;
  }
  __assert_fail("ctx->parent_handle->poll_ctx == ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/fs-poll.c"
                ,0xb1,"void timer_cb(uv_timer_t *)");
}

Assistant:

static void timer_cb(uv_timer_t* handle) {
  ASSERT_PTR_EQ(handle, &timer);
  uv_close((uv_handle_t*) handle, timer_close_cb);

  /*
   * The most important assert of the test: we have not received
   * tcp_close_cb yet.
   */
  ASSERT_OK(called_tcp_close_cb);
  uv_close((uv_handle_t*) &tcp, tcp_close_cb);

  called_timer_cb++;
}